

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<void> __thiscall kj::anon_unknown_123::AsyncPipe::whenWriteDisconnected(AsyncPipe *this)

{
  WeakFulfillerBase *pWVar1;
  undefined8 *puVar2;
  long *plVar3;
  PromiseArenaMember *node;
  WeakFulfiller<void> *params;
  long in_RSI;
  PromiseArenaMember *local_70;
  WeakFulfillerBase *local_68;
  long *local_60;
  Promise<void> local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    kj::_::readyNow();
  }
  else if (*(char *)(in_RSI + 0x50) == '\x01') {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  }
  else {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    pWVar1 = &params->super_WeakFulfillerBase;
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_00605058;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_00605090;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&local_70,params);
    local_60 = (long *)0x0;
    puVar2 = *(undefined8 **)(in_RSI + 0x40);
    plVar3 = *(long **)(in_RSI + 0x48);
    *(WeakFulfillerBase **)(in_RSI + 0x40) = pWVar1;
    *(WeakFulfiller<void> **)(in_RSI + 0x48) = params;
    local_68 = pWVar1;
    if (plVar3 != (long *)0x0) {
      (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
    ;
    pcStack_40 = "whenWriteDisconnected";
    local_38 = 0x130000017f;
    Promise<void>::fork(&local_58);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
    if (*(char *)(in_RSI + 0x50) == '\x01') {
      *(undefined1 *)(in_RSI + 0x50) = 0;
      plVar3 = *(long **)(in_RSI + 0x60);
      if (plVar3 != (long *)0x0) {
        *(undefined8 *)(in_RSI + 0x60) = 0;
        (**(code **)**(undefined8 **)(in_RSI + 0x58))
                  (*(undefined8 **)(in_RSI + 0x58),(long)plVar3 + *(long *)(*plVar3 + -0x10));
      }
    }
    plVar3 = local_60;
    *(undefined4 *)(in_RSI + 0x58) = local_58.super_PromiseBase.node.ptr._0_4_;
    *(undefined4 *)(in_RSI + 0x5c) = local_58.super_PromiseBase.node.ptr._4_4_;
    *(undefined4 *)(in_RSI + 0x60) = uStack_50;
    *(undefined4 *)(in_RSI + 100) = uStack_4c;
    *(undefined1 *)(in_RSI + 0x50) = 1;
    if (local_60 != (long *)0x0) {
      local_60 = (long *)0x0;
      (**(local_68->super_Disposer)._vptr_Disposer)
                (local_68,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    node = local_70;
    if (local_70 != (PromiseArenaMember *)0x0) {
      local_70 = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (readAborted) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(p, readAbortPromise) {
      return p.addBranch();
    } else {
      auto paf = newPromiseAndFulfiller<void>();
      readAbortFulfiller = kj::mv(paf.fulfiller);
      auto fork = paf.promise.fork();
      auto result = fork.addBranch();
      readAbortPromise = kj::mv(fork);
      return result;
    }